

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain_typed_unittest.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::
TargetOnly<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::~TargetOnly
          (TargetOnly<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST_P(VerifyCertificateChainSingleRootTest, TargetOnly) {
  this->RunTest("target-only/trusted_anchor.test");
  this->RunTest("target-only/trusted_leaf-and-trust_anchor.test");
  this->RunTest("target-only/trusted_leaf.test");
  this->RunTest("target-only/trusted_leaf_require_self_signed.test");
  this->RunTest("target-only/trusted_leaf-not_after.test");
  this->RunTest("target-only/trusted_leaf-wrong_eku.test");

  this->RunTest("target-selfissued/trusted_anchor.test");
  this->RunTest("target-selfissued/trusted_leaf-and-trust_anchor.test");
  this->RunTest("target-selfissued/trusted_leaf.test");
  this->RunTest("target-selfissued/trusted_leaf_require_self_signed.test");
}